

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O0

void __thiscall libtorrent::aux::socks5::handshake3(socks5 *this,error_code *e)

{
  bool bVar1;
  pointer data;
  undefined1 local_70 [64];
  mutable_buffer local_30;
  operation_t local_19;
  prop_fns<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *local_18;
  error_code *e_local;
  socks5 *this_local;
  
  if ((this->m_abort & 1U) == 0) {
    local_18 = (prop_fns<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)e;
    e_local = (error_code *)this;
    bVar1 = boost::system::error_code::operator_cast_to_bool(e);
    if (bVar1) {
      bVar1 = alert_manager::should_post<libtorrent::socks5_alert>(this->m_alerts);
      if (bVar1) {
        local_19 = handshake;
        alert_manager::
        emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::operation_t,boost::system::error_code_const&>
                  (this->m_alerts,&this->m_proxy_addr,&local_19,(error_code *)local_18);
      }
      this->m_failures = this->m_failures + 1;
      retry_connection(this);
    }
    else {
      data = ::std::array<char,_270UL>::data(&this->m_tmp_buf);
      local_30 = boost::asio::buffer(data,2);
      local_70._16_8_ = handshake4;
      local_70._24_4_ = 0;
      local_70[0x1c] = '\0';
      local_70._29_3_ = 0;
      self((socks5 *)local_70);
      ::std::
      bind<void(libtorrent::aux::socks5::*)(boost::system::error_code_const&),std::shared_ptr<libtorrent::aux::socks5>,std::_Placeholder<1>const&>
                ((type *)(local_70 + 0x20),(offset_in_socks5_to_subr *)(local_70 + 0x10),
                 (shared_ptr<libtorrent::aux::socks5> *)local_70,
                 (_Placeholder<1> *)&::std::placeholders::_1);
      boost::asio::
      async_read<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,boost::asio::mutable_buffer,std::_Bind<void(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
                (&this->m_socks5_sock,&local_30,
                 (_Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
                  *)(local_70 + 0x20),(type *)0x0);
      ::std::
      _Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
      ::~_Bind((_Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
                *)(local_70 + 0x20));
      ::std::shared_ptr<libtorrent::aux::socks5>::~shared_ptr
                ((shared_ptr<libtorrent::aux::socks5> *)local_70);
    }
  }
  return;
}

Assistant:

void socks5::handshake3(error_code const& e)
{
	COMPLETE_ASYNC("socks5::on_handshake3");
	if (m_abort) return;
	if (e)
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::handshake, e);
		++m_failures;
		retry_connection();
		return;
	}

	ADD_OUTSTANDING_ASYNC("socks5::on_handshake4");
	boost::asio::async_read(m_socks5_sock, boost::asio::buffer(m_tmp_buf.data(), 2)
		, std::bind(&socks5::handshake4, self(), _1));
}